

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

int waserror(int status,int signal_expected)

{
  bool local_22;
  bool local_21;
  int signal_received;
  int exit_status;
  int was_exit;
  int was_sig;
  int signal_expected_local;
  int status_local;
  
  if (((char)(((byte)status & 0x7f) + 1) >> 1 < '\x01') ||
     (local_21 = true, (status & 0x7fU) == signal_expected)) {
    local_22 = (status & 0x7fU) == 0 && (int)(status & 0xff00U) >> 8 != 0;
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

static int waserror(int status, int signal_expected)
{
    int was_sig = WIFSIGNALED(status);
    int was_exit = WIFEXITED(status);
    int exit_status = WEXITSTATUS(status);
    int signal_received = WTERMSIG(status);

    return ((was_sig && (signal_received != signal_expected)) ||
            (was_exit && exit_status != 0));
}